

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O1

int pele::physics::reactions::cvode::Precond
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  realtype **a;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int i_2;
  sunindextype sVar14;
  realtype *prVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  int k_1;
  long lVar19;
  long lVar20;
  int k;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  double dVar23;
  double dVar24;
  Real T_1;
  Real invT;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  Real c [9];
  Real h_RT [9];
  Real T;
  Real dcRdT [9];
  Real c_R [9];
  Real activity [9];
  Real massfrac [9];
  undefined1 local_868 [16];
  double local_858;
  double dStack_850;
  undefined1 local_848 [16];
  double local_838;
  double dStack_830;
  undefined8 local_828;
  double local_818 [10];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  double local_758;
  double dStack_750;
  double local_748;
  double local_740;
  undefined1 local_738 [16];
  double local_728;
  double dStack_720;
  double local_718;
  undefined1 local_708 [16];
  double local_6f8;
  undefined8 uStack_6f0;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  double local_6a0;
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  double local_678;
  double dStack_670;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  double local_630;
  double local_628 [2];
  undefined1 local_618 [16];
  double local_608;
  undefined1 auStack_600 [16];
  undefined1 auStack_5f0 [24];
  double local_5d8 [8];
  undefined1 *local_598;
  double local_590 [16];
  undefined1 local_510 [16];
  double local_500;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double local_4b0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double dStack_470;
  double local_468;
  double local_460;
  double local_448;
  double local_440;
  double dStack_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  double local_410;
  double local_3f8;
  undefined1 auStack_3f0 [16];
  double local_3e0;
  double local_3d8;
  undefined1 local_3d0 [16];
  double local_3c0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double dStack_378;
  double local_370;
  undefined1 local_308 [16];
  double local_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double local_2e0;
  double dStack_2d8;
  double local_2d0;
  realtype local_2c0;
  undefined1 local_2b8 [16];
  double local_2a8;
  double local_2a0;
  double local_298;
  int local_28c;
  realtype local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  double local_260;
  double local_258 [4];
  undefined1 local_238 [16];
  double local_228;
  double dStack_220;
  double local_218 [2];
  double local_208 [10];
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  undefined1 local_178 [16];
  double local_168 [10];
  double local_118 [10];
  double local_c8 [10];
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_178._8_4_ = in_XMM1_Dc;
  local_178._0_8_ = gamma;
  local_178._12_4_ = in_XMM1_Dd;
  prVar15 = N_VGetArrayPointer(u);
  iVar1 = *(int *)((long)user_data + 0x14);
  puVar2 = *(undefined8 **)((long)user_data + 0xb0);
  puVar3 = *(undefined8 **)((long)user_data + 0xa8);
  puVar4 = *(undefined8 **)((long)user_data + 0xb8);
  local_168[0] = 2.016;
  local_168[1] = 31.998;
  local_168[2] = 18.015;
  local_168[3] = 1.008;
  local_168[4] = 15.999;
  local_168[5] = 17.007;
  local_168[6] = 33.006;
  local_168[7] = 34.014;
  local_168[8] = 28.014;
  if (jok == 0) {
    dVar26 = 0.0;
    lVar18 = 0;
    do {
      dVar26 = dVar26 + prVar15[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 9);
    local_c8[6] = 0.0;
    local_c8[7] = 0.0;
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[8] = 0.0;
    lVar18 = 0;
    do {
      local_c8[lVar18] = prVar15[lVar18] * (1.0 / dVar26);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 9);
    local_28c = iVar1;
    local_288 = prVar15[9];
    uStack_280 = 0;
    local_118[6] = 0.0;
    local_118[7] = 0.0;
    local_118[4] = 0.0;
    local_118[5] = 0.0;
    local_118[2] = 0.0;
    local_118[3] = 0.0;
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[8] = 0.0;
    local_5d8[0] = 0.49603174603174605;
    local_5d8[1] = 0.03125195324707794;
    local_5d8[2] = 0.055509297807382736;
    local_5d8[3] = 0.9920634920634921;
    local_5d8[4] = 0.06250390649415588;
    local_5d8[5] = 0.05879931792791203;
    local_5d8[6] = 0.030297521662727988;
    local_5d8[7] = 0.029399658963956014;
    local_598 = &DAT_3fa246cdaf410bdd;
    lVar18 = 0;
    do {
      local_118[lVar18] = local_c8[lVar18] * dVar26 * local_5d8[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 9);
    lVar18 = 0;
    memset(local_5d8,0,800);
    do {
      local_818[lVar18] = local_118[lVar18] * 1000000.0;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 9);
    pdVar17 = local_5d8;
    lVar18 = 0;
    memset(pdVar17,0,800);
    local_838 = 0.0;
    dStack_830 = 0.0;
    local_848 = ZEXT816(0);
    local_858 = 0.0;
    dStack_850 = 0.0;
    local_868 = ZEXT816(0);
    local_828 = 0;
    dVar26 = log(local_288);
    local_7b8._8_4_ = extraout_XMM0_Dc;
    local_7b8._0_8_ = dVar26;
    local_7b8._12_4_ = extraout_XMM0_Dd;
    local_198 = local_288 * local_288;
    local_188 = local_288 * local_198;
    dVar25 = 1.0 / local_288;
    local_688._0_8_ = 12186.6002121605 / local_288;
    local_798._0_8_ = 0.0;
    uStack_180 = uStack_280;
    uStack_190 = uStack_280;
    do {
      local_798._0_8_ = (double)local_798._0_8_ + local_818[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 9);
    local_1a8 = local_288 * local_188;
    if (1000.0 <= local_288) {
      local_678 = local_188 * -1.479401233333333e-12 +
                  local_198 * 2.098069983333333e-08 +
                  local_288 * -0.0003067598445 +
                  dVar26 * -3.69757819 + dVar25 * -1233.93018 + 0.5084126000000002;
      dStack_670 = local_188 * -1.000830325e-11 +
                   local_198 * 1.455043351666667e-07 +
                   local_288 * -0.001528146445 +
                   dVar26 * -2.67214561 + dVar25 * -29899.209 + -4.190671200000001;
      dVar28 = local_1a8 * 6.6597938e-17 +
               local_188 * -2.54348895e-12 +
               local_198 * 4.318045966666667e-08 +
               local_288 * -0.00052825224 + dVar26 * -2.86472886 + dVar25 * 3683.62875 + -2.83691187
      ;
      local_6b8._8_4_ = SUB84(dVar28,0);
      local_6b8._0_8_ =
           local_1a8 * 5.39542675e-16 +
           local_188 * -9.520530833333334e-12 +
           local_198 * 1.056096916666667e-07 +
           local_288 * -0.001119910065 +
           dVar26 * -4.0172109 + dVar25 * 111.856713 + 0.2321087500000001;
      local_6b8._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = local_1a8 * -0.0 +
               local_188 * -0.0 +
               local_198 * -0.0 +
               local_288 * -0.0 + dVar26 * -2.5 + dVar25 * 25471.627 + 2.960117638;
      local_6c8._8_4_ = SUB84(dVar28,0);
      local_6c8._0_8_ =
           local_1a8 * 2.18402575e-17 +
           local_188 * -3.792556183333333e-13 +
           local_198 * 5.171338916666667e-10 +
           local_288 * 1.377530955e-05 + dVar26 * -2.54205966 + dVar25 * 29230.8027 + -2.37824845;
      local_6c8._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = local_1a8 * 7.1582678e-16 +
               local_188 * -1.957419641666667e-11 +
               local_198 * 2.4578147e-07 +
               local_288 * -0.002168068195 +
               dVar26 * -4.57316685 + dVar25 * -18006.9609 + 4.072029891;
      local_648._8_4_ = SUB84(dVar28,0);
      local_648._0_8_ =
           local_1a8 * -7.91375895e-17 +
           local_188 * 7.692981816666667e-13 +
           local_198 * 9.389714483333333e-09 +
           local_288 * -0.0003500322055 + dVar26 * -2.99142337 + dVar25 * -835.033997 + 4.34653354;
      local_648._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = 5.68217655e-17;
      dVar23 = 3.195808935e-16;
    }
    else {
      local_678 = local_188 * -1.094897691666667e-10 +
                  local_198 * 9.593584116666666e-08 +
                  local_288 * -0.000563743175 +
                  dVar26 * -3.2129364 + dVar25 * -1005.24902 + -2.82180119;
      dStack_670 = local_188 * -5.807151058333333e-10 +
                   local_198 * 1.059116055e-06 +
                   local_288 * -0.00173749123 +
                   dVar26 * -3.38684249 + dVar25 * -30208.1133 + 0.7966096399999998;
      dVar28 = local_1a8 * -1.031186895e-13 +
               local_188 * 4.832113691666666e-10 +
               local_198 * -1.087941151666667e-06 +
               local_288 * 0.001612724695 + dVar26 * -4.12530561 + dVar25 * 3346.30913 + 4.81573857;
      local_6b8._8_4_ = SUB84(dVar28,0);
      local_6b8._0_8_ =
           local_1a8 * -4.646125620000001e-13 +
           local_188 * 2.02303245e-09 +
           local_198 * -3.526381516666666e-06 +
           local_288 * 0.002374560255 +
           dVar26 * -4.30179801 + dVar25 * 294.80804 + 0.5851355599999999;
      local_6b8._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = local_1a8 * -0.0 +
               local_188 * -0.0 +
               local_198 * -0.0 +
               local_288 * -0.0 + dVar26 * -2.5 + dVar25 * 25471.627 + 2.960117608;
      local_6c8._8_4_ = SUB84(dVar28,0);
      local_6c8._0_8_ =
           local_1a8 * -1.94534818e-14 +
           local_188 * 1.335702658333333e-10 +
           local_198 * -4.035052833333333e-07 +
           local_288 * 0.000819083245 +
           dVar26 * -2.94642878 + dVar25 * 29147.6445 + -0.01756619999999964;
      local_6c8._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = local_1a8 * -1.235757375e-13 +
               local_188 * 3.854837933333333e-10 +
               local_198 * 2.475020966666667e-08 +
               local_288 * -0.003284612905 +
               dVar26 * -3.38875365 + dVar25 * -17663.1465 + -3.39660955;
      local_648._8_4_ = SUB84(dVar28,0);
      local_648._0_8_ =
           local_1a8 * -2.06743612e-14 +
           local_188 * 7.896195275e-12 +
           local_198 * 1.357169215e-07 +
           local_288 * -0.000412472087 + dVar26 * -3.29812431 + dVar25 * -1012.52087 + 6.5922184;
      local_648._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dVar28 = 4.38427696e-14;
      dVar23 = 1.253294235e-13;
    }
    local_678 = local_1a8 * dVar28 + local_678;
    dStack_670 = local_1a8 * dVar23 + dStack_670;
    local_6f8 = dVar25 * dVar25;
    uStack_6f0 = 0;
    local_7a8._0_8_ = 1.0 / (12186.6002121605 / local_288);
    local_260 = dVar25 * 25471.627;
    local_740 = local_1a8 * 0.0 + local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 2.5 +
                local_260;
    uStack_1a0 = uStack_280;
    if (1000.0 <= local_288) {
      local_758 = dVar25 * -835.033997 +
                  local_1a8 * 3.16550358e-16 +
                  local_188 * -2.30789455e-12 +
                  local_198 * -1.8779429e-08 + local_288 * 0.000350032206 + 2.99142337;
      dStack_750 = dVar25 * -1233.93018 +
                   local_1a8 * -2.27287062e-16 +
                   local_188 * 4.4382037e-12 +
                   local_198 * -4.19613997e-08 + local_288 * 0.000306759845 + 3.69757819;
      local_748 = dVar25 * -29899.209 +
                  local_1a8 * -1.27832357e-15 +
                  local_188 * 3.00249098e-11 +
                  local_198 * -2.9100867e-07 + local_288 * 0.00152814644 + 2.67214561;
      dVar28 = dVar25 * 3683.62875 +
               local_1a8 * -2.66391752e-16 +
               local_188 * 7.63046685e-12 +
               local_198 * -8.63609193e-08 + local_288 * 0.00052825224 + 2.86472886;
      local_738._8_4_ = SUB84(dVar28,0);
      local_738._0_8_ =
           dVar25 * 29230.8027 +
           local_1a8 * -8.736103e-17 +
           local_188 * 1.13776685e-12 +
           local_198 * -1.03426778e-09 + local_288 * -1.37753096e-05 + 2.54205966;
      local_738._12_4_ = (int)((ulong)dVar28 >> 0x20);
      local_728 = dVar25 * 111.856713 +
                  local_1a8 * -2.1581707e-15 +
                  local_188 * 2.85615925e-11 +
                  local_198 * -2.11219383e-07 + local_288 * 0.00111991006 + 4.0172109;
      dStack_720 = dVar25 * -18006.9609 +
                   local_1a8 * -2.86330712e-15 +
                   local_188 * 5.87225893e-11 +
                   local_198 * -4.9156294e-07 + local_288 * 0.0021680682 + 4.57316685;
      local_718 = local_1a8 * -1.3506702e-15 +
                  local_188 * 2.52426e-11 +
                  local_198 * -1.89492033e-07 + local_288 * 0.0007439885 + 2.92664;
      uVar21 = 0xb089a027;
      uVar22 = 0xc08cd661;
    }
    else {
      local_758 = dVar25 * -1012.52087 +
                  local_1a8 * 8.26974448e-14 +
                  local_188 * -2.36885858e-11 +
                  local_198 * -2.71433843e-07 + local_288 * 0.000412472087 + 3.29812431;
      dStack_750 = dVar25 * -1005.24902 +
                   local_1a8 * -1.75371078e-13 +
                   local_188 * 3.28469308e-10 +
                   local_198 * -1.91871682e-07 + local_288 * 0.000563743175 + 3.2129364;
      local_748 = dVar25 * -30208.1133 +
                  local_1a8 * -5.01317694e-13 +
                  local_188 * 1.74214532e-09 +
                  local_198 * -2.11823211e-06 + local_288 * 0.00173749123 + 3.38684249;
      dVar28 = dVar25 * 3346.30913 +
               local_1a8 * 4.12474758e-13 +
               local_188 * -1.44963411e-09 +
               local_198 * 2.1758823e-06 + local_288 * -0.0016127247 + 4.12530561;
      local_738._8_4_ = SUB84(dVar28,0);
      local_738._0_8_ =
           dVar25 * 29147.6445 +
           local_1a8 * 7.78139272e-14 +
           local_188 * -4.00710797e-10 +
           local_198 * 8.07010567e-07 + local_288 * -0.000819083245 + 2.94642878;
      local_738._12_4_ = (int)((ulong)dVar28 >> 0x20);
      local_728 = dVar25 * 294.80804 +
                  local_1a8 * 1.85845025e-12 +
                  local_188 * -6.06909735e-09 +
                  local_198 * 7.05276303e-06 + local_288 * -0.00237456025 + 4.30179801;
      dStack_720 = dVar25 * -17663.1465 +
                   local_1a8 * 4.9430295e-13 +
                   local_188 * -1.15645138e-09 +
                   local_198 * -4.95004193e-08 + local_288 * 0.0032846129 + 3.38875365;
      local_718 = local_1a8 * -4.88971e-13 +
                  local_188 * 1.41037875e-09 +
                  local_198 * -1.321074e-06 + local_288 * 0.00070412 + 3.298677;
      uVar21 = 0x33333333;
      uVar22 = 0xc08fe733;
    }
    local_718 = (double)CONCAT44(uVar22,uVar21) * dVar25 + local_718;
    local_788._0_8_ =
         local_818[2] * 10.0 +
         local_818[1] * -0.21999999999999997 + local_818[0] + (double)local_798._0_8_;
    local_6e8._0_8_ = local_818[1] * local_818[3];
    local_6a0 = dVar25 * -0.0;
    dVar26 = exp(dVar26 * 0.6 + local_6a0);
    local_668._0_8_ = dVar26 * 1475000.0;
    local_2b8._8_4_ = (int)uStack_6f0;
    local_2b8._0_8_ = local_6f8 * 0.0;
    local_2b8._12_4_ = (int)((ulong)uStack_6f0 >> 0x20);
    local_768._0_8_ = dVar25 * 0.6 + local_6f8 * 0.0;
    dVar26 = exp((double)local_7b8._0_8_ * -1.72 + dVar25 * -264.08810621431707);
    dVar26 = dVar26 * 6.366e+20 * (((double)local_788._0_8_ * 1e-12) / (double)local_668._0_8_);
    local_698._0_8_ = dVar26 / (dVar26 + 1.0);
    local_778._0_8_ =
         ((dVar25 * -1.72 + local_6f8 * 264.08810621431707) - (double)local_768._0_8_) *
         0.43429448190325176;
    local_7c8._0_8_ = (double)local_778._0_8_ / (dVar26 + 1.0);
    local_658._0_8_ = log10(dVar26);
    local_6d8._8_4_ = (int)uStack_280;
    local_6d8._0_8_ = local_288 / -1e-30;
    local_6d8._12_4_ = (int)((ulong)uStack_280 >> 0x20);
    dVar26 = exp(local_288 / -1e-30);
    local_708._0_8_ = dVar26 * 0.19999999999999996;
    dVar26 = local_288 / -1e+30;
    dVar28 = exp(dVar26);
    local_278._0_8_ = dVar28 * 0.8;
    local_630 = (double)local_708._0_8_ + dVar28 * 0.8 + 0.0;
    local_788._0_8_ = log10(local_630);
    dVar28 = (double)local_788._0_8_ * -1.27 + 0.75;
    local_1b8._8_4_ = extraout_XMM0_Dc_00;
    local_1b8._0_8_ = dVar28;
    local_1b8._12_4_ = extraout_XMM0_Dd_00;
    local_2a0 = (double)local_788._0_8_ * -0.67 + -0.4 + (double)local_658._0_8_;
    local_298 = 1.0 / (local_2a0 * -0.14 + dVar28);
    local_2a0 = local_2a0 * local_298;
    local_2a8 = 1.0 / (local_2a0 * local_2a0 + 1.0);
    local_658._0_8_ = pow(10.0,(double)local_788._0_8_ * local_2a8);
    dVar28 = ((double)local_788._0_8_ + (double)local_788._0_8_) * local_2a8 * local_2a8 * local_2a0
             * local_298;
    dVar23 = -(double)local_1b8._0_8_ * dVar28 * local_298;
    local_788._0_8_ =
         (dVar28 * local_2a0 * -1.27 + dVar23 * -0.67 + local_2a8) *
         ((double)local_278._0_8_ / -1e+30 + (double)local_708._0_8_ / -1e-30) *
         (0.43429448190325176 / local_630) + (double)local_778._0_8_ * dVar23 +
         (double)local_7c8._0_8_;
    local_778._0_8_ = local_818[6];
    local_708._8_4_ = local_6c8._8_4_;
    local_708._0_8_ = local_6c8._8_8_;
    local_708._12_4_ = local_6c8._12_4_;
    dVar28 = local_6c8._8_8_ + local_678;
    local_7c8._8_4_ = local_6c8._8_4_;
    local_7c8._0_8_ = dVar28;
    local_7c8._12_4_ = local_6c8._12_4_;
    dVar28 = exp(dVar28 - (double)local_6b8._0_8_);
    dVar28 = (double)local_668._0_8_ / (dVar28 * (double)local_7a8._0_8_);
    dVar27 = (double)local_658._0_8_ * (double)local_698._0_8_;
    dVar23 = ((double)local_668._0_8_ * (double)local_6e8._0_8_ - (double)local_778._0_8_ * dVar28)
             * dVar27;
    local_868._8_8_ = (double)local_868._8_8_ - dVar23;
    dStack_850 = dStack_850 - dVar23;
    local_838 = dVar23 + local_838;
    lVar18 = 0;
    local_628[0] = 0.0;
    local_628[1] = local_818[3] * (double)local_668._0_8_ * dVar27 + 0.0;
    local_618._0_8_ = 0;
    local_618._8_8_ = (double)local_668._0_8_ * dVar27 * local_818[1] + 0.0;
    local_608 = 0.0;
    auStack_600._0_8_ = 0;
    auStack_600._8_8_ = 0.0 - dVar28 * dVar27;
    auStack_5f0._0_16_ = ZEXT816(0);
    pdVar16 = local_5d8 + 1;
    do {
      dVar24 = local_628[lVar18];
      *pdVar16 = *pdVar16 - dVar24;
      pdVar16[2] = pdVar16[2] - dVar24;
      pdVar16[5] = dVar24 + pdVar16[5];
      lVar18 = lVar18 + 1;
      pdVar16 = pdVar16 + 10;
    } while (lVar18 != 9);
    dVar28 = dVar27 * ((double)local_768._0_8_ * (double)local_668._0_8_ * (double)local_6e8._0_8_ +
                      -((double)local_768._0_8_ -
                       ((local_728 - (dStack_750 + local_740)) + 1.0) * dVar25) * dVar28 *
                      (double)local_778._0_8_) +
             (double)local_788._0_8_ * 2.302585092994046 * dVar23;
    pdVar16 = local_5d8 + 7;
    local_308._8_8_ = (double)local_308._8_8_ - dVar28;
    dStack_2f0 = dStack_2f0 - dVar28;
    dStack_2d8 = dVar28 + dStack_2d8;
    local_788._0_8_ = local_818[2] * 11.0 + local_818[0] * 1.5 + (double)local_798._0_8_;
    local_778._0_8_ = local_818[7];
    local_768._8_8_ = local_7b8._8_8_;
    local_768._0_8_ = (double)local_7b8._0_8_ * 0.0;
    local_6e8._0_8_ = exp(dVar25 * -24370.78312492259 + (double)local_7b8._0_8_ * 0.0);
    local_6e8._0_8_ = (double)local_6e8._0_8_ * 295100000000000.0;
    local_668._8_8_ = 0;
    local_668._0_8_ = dVar25 * 0.0;
    local_698._0_8_ = local_6f8 * 24370.78312492259 + dVar25 * 0.0;
    dVar28 = exp(dVar25 * -22896.35829411476 + (double)local_768._0_8_);
    dVar28 = dVar28 * 1.202e+17 * (((double)local_788._0_8_ * 1e-06) / (double)local_6e8._0_8_);
    local_658._0_8_ = dVar28 / (dVar28 + 1.0);
    dVar23 = ((local_6f8 * 22896.35829411476 + (double)local_668._0_8_) - (double)local_698._0_8_) *
             0.43429448190325176;
    local_278._0_8_ = dVar23;
    local_668._0_8_ = dVar23 / (dVar28 + 1.0);
    local_630 = log10(dVar28);
    dVar28 = exp((double)local_6d8._0_8_);
    local_788._0_8_ = dVar28 * 0.5;
    dVar26 = exp(dVar26);
    dVar28 = (double)local_788._0_8_ + dVar26 * 0.5 + 0.0;
    local_1b8._0_8_ = dVar28;
    local_2a8 = log10(dVar28);
    dVar28 = local_2a8 * -1.27 + 0.75;
    local_768._8_4_ = extraout_XMM0_Dc_01;
    local_768._0_8_ = dVar28;
    local_768._12_4_ = extraout_XMM0_Dd_01;
    local_298 = local_2a8 * -0.67 + -0.4 + local_630;
    local_630 = 1.0 / (local_298 * -0.14 + dVar28);
    local_298 = local_298 * local_630;
    local_2a0 = 1.0 / (local_298 * local_298 + 1.0);
    dVar28 = pow(10.0,local_2a8 * local_2a0);
    dVar27 = (local_2a8 + local_2a8) * local_2a0 * local_2a0 * local_298 * local_630;
    uVar13 = local_768._12_4_;
    dVar23 = -(double)local_768._0_8_ * dVar27 * local_630;
    local_768._8_4_ = local_768._8_4_;
    local_768._0_8_ =
         dVar23 * (double)local_278._0_8_ +
         (dVar27 * local_298 * -1.27 + dVar23 * -0.67 + local_2a0) *
         ((dVar26 * 0.5) / -1e+30 + (double)local_788._0_8_ / -1e-30) *
         (0.43429448190325176 / (double)local_1b8._0_8_) + (double)local_668._0_8_;
    local_768._12_4_ = uVar13 ^ 0x80000000;
    dVar26 = local_6b8._8_8_;
    local_788._8_4_ = local_6b8._8_4_;
    local_788._0_8_ = dVar26;
    local_788._12_4_ = local_6b8._12_4_;
    local_668._8_4_ = local_648._8_4_;
    local_668._0_8_ = local_648._8_8_;
    local_668._12_4_ = local_648._12_4_;
    dVar23 = local_818[5] * local_818[5];
    local_6d8._0_8_ = dVar28;
    dVar26 = exp(local_648._8_8_ - (dVar26 + dVar26));
    dVar26 = (double)local_6e8._0_8_ / (dVar26 * (double)local_688._0_8_);
    dVar27 = (double)local_6d8._0_8_ * (double)local_658._0_8_;
    dVar28 = ((double)local_6e8._0_8_ * (double)local_778._0_8_ - dVar23 * dVar26) * dVar27;
    local_848._8_8_ = dVar28 + dVar28 + (double)local_848._8_8_;
    dStack_830 = dStack_830 - dVar28;
    local_628[0] = 0.0;
    local_628[1] = 0.0;
    local_618 = ZEXT816(0);
    lVar18 = 0;
    local_608 = 0.0;
    auStack_600._8_8_ = 0;
    auStack_600._0_8_ = dVar26 * dVar27 * -2.0 * local_818[5] + 0.0;
    auStack_5f0._8_8_ = 0;
    auStack_5f0._0_8_ = (double)local_6e8._0_8_ * dVar27 + 0.0;
    do {
      dVar24 = local_628[lVar18];
      pdVar16[-2] = dVar24 + dVar24 + pdVar16[-2];
      *pdVar16 = *pdVar16 - dVar24;
      lVar18 = lVar18 + 1;
      pdVar16 = pdVar16 + 10;
    } while (lVar18 != 9);
    dVar26 = dVar27 * ((double)local_698._0_8_ * (double)local_6e8._0_8_ * (double)local_778._0_8_ +
                      -((double)local_698._0_8_ -
                       ((((double)local_738._8_8_ + (double)local_738._8_8_) - dStack_720) + -1.0) *
                       dVar25) * dVar26 * dVar23) +
             (double)local_768._0_8_ * 2.302585092994046 * dVar28;
    local_2e0 = dVar26 + dVar26 + local_2e0;
    local_2d0 = local_2d0 - dVar26;
    local_768._0_8_ = local_818[0];
    local_6e8._0_8_ = local_818[2] * 11.0 + local_818[0] * 1.5 + (double)local_798._0_8_;
    local_6d8._0_8_ = exp((double)local_7b8._0_8_ * -1.4 + dVar25 * -52525.755576696676);
    local_6d8._0_8_ = (double)local_6d8._0_8_ * 45770000000000.0;
    dVar28 = dVar25 * -1.4 + local_6f8 * 52525.755576696676;
    local_698._0_8_ = local_818[3] * local_818[3];
    dVar26 = exp((double)local_648._0_8_ - ((double)local_708._0_8_ + (double)local_708._0_8_));
    dVar26 = (double)local_6d8._0_8_ / ((double)local_688._0_8_ * dVar26);
    local_628[1] = (double)local_6d8._0_8_ * (double)local_768._0_8_ -
                   (double)local_698._0_8_ * dVar26;
    dVar23 = (double)local_6e8._0_8_ * local_628[1];
    local_868._0_8_ = (double)local_868._0_8_ - dVar23;
    dStack_850 = dVar23 + dVar23 + dStack_850;
    local_628[0] = local_628[1] * 2.5 + (double)local_6d8._0_8_ * (double)local_6e8._0_8_;
    local_618._0_8_ = local_628[1] * 12.0;
    local_618._8_8_ = dVar26 * (double)local_6e8._0_8_ * -2.0 * local_818[3] + local_628[1];
    local_608 = local_628[1];
    uVar21 = (undefined4)((ulong)local_628[1] >> 0x20);
    auStack_5f0._8_4_ = SUB84(local_628[1],0);
    auStack_5f0._0_8_ = local_628[1];
    auStack_5f0._12_4_ = uVar21;
    auStack_600._8_4_ = SUB84(local_628[1],0);
    auStack_600._0_8_ = local_628[1];
    auStack_600._12_4_ = uVar21;
    lVar18 = 0;
    do {
      dVar23 = local_628[lVar18];
      *pdVar17 = *pdVar17 - dVar23;
      pdVar17[3] = dVar23 + dVar23 + pdVar17[3];
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 10;
    } while (lVar18 != 9);
    dVar26 = (double)local_6e8._0_8_ *
             (dVar28 * (double)local_6d8._0_8_ * (double)local_768._0_8_ -
             (dVar28 - (((local_740 + local_740) - local_758) + -1.0) * dVar25) * dVar26 *
             (double)local_698._0_8_);
    pdVar17 = local_5d8 + 1;
    local_308._0_8_ = (double)local_308._0_8_ - dVar26;
    dStack_2f0 = dVar26 + dVar26 + dStack_2f0;
    local_688._0_8_ = local_818[2] * 11.0 + local_818[0] * 1.5 + (double)local_798._0_8_;
    local_768._0_8_ = local_818[4] * local_818[4];
    local_6d8._0_8_ = exp((double)local_7b8._0_8_ * -0.5 + local_6a0);
    local_6d8._0_8_ = (double)local_6d8._0_8_ * 6165.0;
    dVar26 = dVar25 * -0.5 + (double)local_2b8._0_8_;
    local_698._0_8_ = local_818[1];
    local_6e8._8_4_ = SUB84(dStack_670,0);
    local_6e8._0_8_ = -local_678;
    local_6e8._12_4_ = (uint)((ulong)dStack_670 >> 0x20) ^ 0x80000000;
    dVar28 = exp(((double)local_6c8._0_8_ + (double)local_6c8._0_8_) - local_678);
    dVar28 = (double)local_6d8._0_8_ / (dVar28 * (double)local_7a8._0_8_);
    local_618._8_8_ =
         (double)local_6d8._0_8_ * (double)local_768._0_8_ - (double)local_698._0_8_ * dVar28;
    dVar23 = (double)local_688._0_8_ * (double)local_618._8_8_;
    local_868._8_8_ = (double)local_868._8_8_ + dVar23;
    local_848._0_8_ = (double)local_848._0_8_ - (dVar23 + dVar23);
    local_628[0] = (double)local_618._8_8_ * 2.5;
    local_628[1] = (double)local_618._8_8_ - dVar28 * (double)local_688._0_8_;
    local_618._0_8_ = (double)local_618._8_8_ * 12.0;
    local_608 = ((double)local_6d8._0_8_ * (double)local_688._0_8_ +
                (double)local_6d8._0_8_ * (double)local_688._0_8_) * local_818[4] +
                (double)local_618._8_8_;
    uVar21 = (undefined4)((ulong)local_618._8_8_ >> 0x20);
    auStack_5f0._8_4_ = (int)local_618._8_8_;
    auStack_5f0._0_8_ = local_618._8_8_;
    auStack_5f0._12_4_ = uVar21;
    auStack_600._8_4_ = (int)local_618._8_8_;
    auStack_600._0_8_ = local_618._8_8_;
    auStack_600._12_4_ = uVar21;
    lVar18 = 0;
    do {
      dVar23 = local_628[lVar18];
      *pdVar17 = *pdVar17 + dVar23;
      pdVar17[3] = pdVar17[3] - (dVar23 + dVar23);
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 10;
    } while (lVar18 != 9);
    local_688._0_8_ =
         (double)local_688._0_8_ *
         (dVar26 * (double)local_6d8._0_8_ * (double)local_768._0_8_ -
         (dVar26 - ((dStack_750 - ((double)local_738._0_8_ + (double)local_738._0_8_)) + 1.0) *
                   dVar25) * dVar28 * (double)local_698._0_8_);
    pdVar17 = local_5d8 + 5;
    local_308._8_8_ = (double)local_308._8_8_ + (double)local_688._0_8_;
    dStack_2e8 = dStack_2e8 - ((double)local_688._0_8_ + (double)local_688._0_8_);
    local_698._8_8_ = 0;
    local_698._0_8_ = local_818[4] * local_818[3];
    local_688._8_8_ = 0;
    local_688._0_8_ = local_818[0] * 1.5 + (double)local_798._0_8_;
    local_768._8_8_ = 0;
    local_768._0_8_ = local_818[2];
    dVar26 = exp(local_6a0 - (double)local_7b8._0_8_);
    dVar26 = dVar26 * 4714000.0;
    local_778._8_4_ = local_2b8._8_4_;
    local_778._0_8_ = local_2b8._0_8_ - dVar25;
    local_778._12_4_ = local_2b8._12_4_;
    local_6d8._0_8_ = local_818[5];
    dVar28 = exp(((double)local_6c8._0_8_ + (double)local_708._0_8_) - (double)local_788._0_8_);
    dVar23 = dVar26 / (dVar28 * (double)local_7a8._0_8_);
    local_628[1] = (double)local_698._0_8_ * dVar26 + -dVar23 * (double)local_6d8._0_8_;
    dVar28 = (double)local_768._0_8_ * 11.0 + (double)local_688._0_8_;
    dVar27 = dVar28 * local_628[1];
    dStack_850 = dStack_850 - dVar27;
    local_848._0_8_ = (double)local_848._0_8_ - dVar27;
    local_848._8_8_ = dVar27 + (double)local_848._8_8_;
    local_628[0] = local_628[1] * 2.5;
    local_618._8_8_ = dVar26 * dVar28 * local_818[4] + local_628[1];
    local_618._0_8_ = local_628[1] * 12.0;
    local_608 = dVar26 * dVar28 * local_818[3] + local_628[1];
    auStack_600._0_8_ = local_628[1] - dVar28 * dVar23;
    auStack_600._8_8_ = local_628[1];
    auStack_5f0._0_8_ = local_628[1];
    auStack_5f0._8_8_ = local_628[1];
    lVar18 = 0;
    do {
      dVar27 = local_628[lVar18];
      pdVar17[-2] = pdVar17[-2] - dVar27;
      pdVar17[-1] = pdVar17[-1] - dVar27;
      *pdVar17 = dVar27 + *pdVar17;
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 10;
    } while (lVar18 != 9);
    dVar28 = ((double)local_778._0_8_ * dVar26 * (double)local_698._0_8_ -
             ((double)local_778._0_8_ -
             (((double)local_738._8_8_ - (local_740 + (double)local_738._0_8_)) + 1.0) * dVar25) *
             dVar23 * (double)local_6d8._0_8_) * dVar28;
    pdVar17 = local_5d8 + 2;
    dStack_2f0 = dStack_2f0 - dVar28;
    auVar5._8_4_ = SUB84(dStack_2e8 - dVar28,0);
    auVar5._0_8_ = dStack_2f0;
    auVar5._12_4_ = (int)((ulong)(dStack_2e8 - dVar28) >> 0x20);
    dStack_2e8 = auVar5._8_8_;
    local_2e0 = dVar28 + local_2e0;
    local_798._0_8_ = local_818[2] * 11.0 + local_818[0] * 1.5 + (double)local_798._0_8_;
    dVar27 = local_818[3] * local_818[5];
    dVar26 = local_7b8._0_8_ + local_7b8._0_8_;
    local_698._8_4_ = local_7b8._8_4_;
    local_698._0_8_ = dVar26;
    local_698._12_4_ = local_7b8._12_4_;
    dVar26 = exp(local_6a0 - dVar26);
    local_658._8_4_ = extraout_XMM0_Dc_02;
    local_658._0_8_ = dVar26 * 38000000000.0;
    local_658._12_4_ = extraout_XMM0_Dd_02;
    local_768._8_8_ = 0;
    local_768._0_8_ = dVar25 + dVar25;
    local_278._8_4_ = local_2b8._8_4_;
    local_278._0_8_ = local_2b8._0_8_ - (dVar25 + dVar25);
    local_278._12_4_ = local_2b8._12_4_;
    local_778._0_8_ = local_818[2];
    local_688._8_4_ = SUB84(dStack_670,0);
    local_688._0_8_ = dStack_670;
    local_688._12_4_ = (int)((ulong)dStack_670 >> 0x20);
    local_6d8._0_8_ = (double)local_708._0_8_ - dStack_670;
    dVar26 = exp((double)local_6d8._0_8_ + (double)local_788._0_8_);
    dVar28 = (double)local_658._0_8_ / ((double)local_7a8._0_8_ * dVar26);
    dVar23 = (double)local_278._0_8_ -
             ((local_748 - (local_740 + (double)local_738._8_8_)) + 1.0) * dVar25;
    local_628[1] = (double)local_658._0_8_ * dVar27 - (double)local_778._0_8_ * dVar28;
    dVar26 = (double)local_798._0_8_ * local_628[1];
    dVar24 = (double)local_278._0_8_ * (double)local_658._0_8_;
    local_858 = local_858 + dVar26;
    dStack_850 = dStack_850 - dVar26;
    local_848._8_8_ = (double)local_848._8_8_ - dVar26;
    local_628[0] = local_628[1] * 2.5;
    dVar26 = local_628[1] + local_818[5] * (double)local_658._0_8_ * (double)local_798._0_8_;
    local_618._8_4_ = SUB84(dVar26,0);
    local_618._0_8_ = -dVar28 * (double)local_798._0_8_ + local_628[1] * 12.0;
    local_618._12_4_ = (int)((ulong)dVar26 >> 0x20);
    local_608 = local_628[1];
    auStack_600._8_8_ = local_628[1];
    auStack_600._0_8_ =
         (double)local_658._0_8_ * (double)local_798._0_8_ * local_818[3] + local_628[1];
    auStack_5f0._8_8_ = local_628[1];
    auStack_5f0._0_8_ = local_628[1];
    lVar18 = 0;
    do {
      dVar26 = local_628[lVar18];
      *pdVar17 = *pdVar17 + dVar26;
      pdVar17[1] = pdVar17[1] - dVar26;
      pdVar17[3] = pdVar17[3] - dVar26;
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 10;
    } while (lVar18 != 9);
    local_798._0_8_ =
         (double)local_798._0_8_ * (dVar24 * dVar27 - dVar23 * dVar28 * (double)local_778._0_8_);
    local_2f8 = local_2f8 + (double)local_798._0_8_;
    dStack_2f0 = dStack_2f0 - (double)local_798._0_8_;
    local_2e0 = local_2e0 - (double)local_798._0_8_;
    local_798._0_8_ = local_818[3] * local_818[1];
    dVar26 = exp((double)local_7b8._0_8_ * -0.406 + dVar25 * -8352.893435692547);
    local_778._8_4_ = extraout_XMM0_Dc_03;
    local_778._0_8_ = dVar26 * 3547000000.0;
    local_778._12_4_ = extraout_XMM0_Dd_03;
    dVar28 = dVar25 * -0.406 + local_6f8 * 8352.893435692547;
    local_7a8._0_8_ = local_818[4] * local_818[5];
    dVar26 = exp(((double)local_7c8._0_8_ - (double)local_6c8._0_8_) - (double)local_788._0_8_);
    dVar26 = (double)local_778._0_8_ / dVar26;
    dVar23 = (double)local_778._0_8_ * (double)local_798._0_8_ - (double)local_7a8._0_8_ * dVar26;
    local_868._8_8_ = (double)local_868._8_8_ - dVar23;
    dStack_850 = dStack_850 - dVar23;
    dVar27 = dVar23 + (double)local_848._8_8_;
    dVar24 = dVar28 * (double)local_778._0_8_ * (double)local_798._0_8_ -
             (dVar28 - (((double)local_738._0_8_ + (double)local_738._8_8_) -
                       (dStack_750 + local_740)) * dVar25) * dVar26 * (double)local_7a8._0_8_;
    dVar28 = local_818[3] * (double)local_778._0_8_;
    local_590[2] = local_590[2] - dVar28;
    local_590[4] = local_590[4] - dVar28;
    local_590[5] = dVar28 + local_590[5];
    local_590[6] = dVar28 + local_590[6];
    dVar28 = (double)local_778._0_8_ * local_818[1];
    dStack_4e0 = dStack_4e0 - dVar28;
    dStack_4d0 = dStack_4d0 - dVar28;
    local_4c8 = dVar28 + local_4c8;
    dStack_4c0 = dVar28 + dStack_4c0;
    dVar28 = local_818[5] * -dVar26;
    local_490 = local_490 - dVar28;
    local_480 = local_480 - dVar28;
    local_478 = dVar28 + local_478;
    dStack_470 = dVar28 + dStack_470;
    dVar26 = -dVar26 * local_818[4];
    local_440 = local_440 - dVar26;
    dStack_430 = dStack_430 - dVar26;
    local_428 = dVar26 + local_428;
    local_848._8_4_ = SUB84(dVar27,0);
    local_848._0_8_ = dVar23 + (double)local_848._0_8_;
    local_848._12_4_ = (int)((ulong)dVar27 >> 0x20);
    auVar6._8_4_ = SUB84(dVar26 + dStack_420,0);
    auVar6._0_8_ = local_428;
    auVar6._12_4_ = (int)((ulong)(dVar26 + dStack_420) >> 0x20);
    dStack_420 = auVar6._8_8_;
    dStack_2f0 = dStack_2f0 - dVar24;
    dStack_2e8 = dVar24 + dStack_2e8;
    auVar9._8_4_ = SUB84(dVar24 + local_2e0,0);
    auVar9._0_8_ = dStack_2e8;
    auVar9._12_4_ = (int)((ulong)(dVar24 + local_2e0) >> 0x20);
    local_2e0 = auVar9._8_8_;
    local_798._0_8_ = local_818[4] * local_818[0];
    local_308._8_8_ = (double)local_308._8_8_ - dVar24;
    dVar26 = exp((double)local_7b8._0_8_ * 2.67 + dVar25 * -3165.232827911689);
    dVar26 = dVar26 * 0.0508;
    local_7a8._0_8_ = local_818[3] * local_818[5];
    local_7c8._0_8_ = dVar25 * 2.67 + local_6f8 * 3165.232827911689;
    dVar28 = exp((((double)local_648._0_8_ - (double)local_708._0_8_) + (double)local_6c8._0_8_) -
                 (double)local_788._0_8_);
    dVar28 = dVar26 / dVar28;
    dVar23 = dVar26 * (double)local_798._0_8_ - (double)local_7a8._0_8_ * dVar28;
    dVar24 = (double)local_7c8._0_8_ * dVar26 * (double)local_798._0_8_ -
             ((double)local_7c8._0_8_ -
             ((local_740 + (double)local_738._8_8_) - (local_758 + (double)local_738._0_8_)) *
             dVar25) * dVar28 * (double)local_7a8._0_8_;
    local_868._0_8_ = (double)local_868._0_8_ - dVar23;
    dStack_850 = dStack_850 + dVar23;
    local_848._8_8_ = dVar23 + (double)local_848._8_8_;
    dVar27 = local_818[4] * dVar26;
    local_5d8[0] = local_5d8[0] - dVar27;
    local_5d8[3] = local_5d8[3] + dVar27;
    local_5d8[4] = local_5d8[4] - dVar27;
    local_5d8[5] = dVar27 + local_5d8[5];
    dVar27 = local_818[3] * -dVar28;
    dVar28 = -dVar28 * local_818[5];
    local_4e8 = local_4e8 - dVar28;
    dStack_4d0 = dStack_4d0 + dVar28;
    local_4c8 = local_4c8 - dVar28;
    dStack_4c0 = dVar28 + dStack_4c0;
    dVar26 = dVar26 * local_818[0];
    local_498 = local_498 - dVar26;
    local_480 = local_480 + dVar26;
    local_478 = local_478 - dVar26;
    dStack_470 = dVar26 + dStack_470;
    local_448 = local_448 - dVar27;
    dStack_430 = dStack_430 + dVar27;
    local_428 = local_428 - dVar27;
    dStack_420 = dVar27 + dStack_420;
    local_308._0_8_ = (double)local_308._0_8_ - dVar24;
    dStack_2f0 = dStack_2f0 + dVar24;
    dStack_2e8 = dStack_2e8 - dVar24;
    local_2e0 = dVar24 + local_2e0;
    local_798._0_8_ = local_818[5] * local_818[0];
    local_848._0_8_ = (double)local_848._0_8_ - dVar23;
    dVar26 = exp((double)local_7b8._0_8_ * 1.51 + dVar25 * -1726.0331637101897);
    dVar26 = dVar26 * 216.0;
    local_7c8._8_8_ = 0;
    local_7c8._0_8_ = dVar25 * 1.51 + local_6f8 * 1726.0331637101897;
    local_7a8._0_8_ = local_818[2] * local_818[3];
    dVar28 = exp((((double)local_648._0_8_ - (double)local_688._0_8_) - (double)local_708._0_8_) +
                 (double)local_788._0_8_);
    dVar28 = dVar26 / dVar28;
    dVar23 = dVar26 * (double)local_798._0_8_ - (double)local_7a8._0_8_ * dVar28;
    dVar27 = (double)local_7c8._0_8_ * dVar26 * (double)local_798._0_8_ -
             ((double)local_7c8._0_8_ -
             ((local_748 + local_740) - (local_758 + (double)local_738._8_8_)) * dVar25) * dVar28 *
             (double)local_7a8._0_8_;
    local_868._0_8_ = (double)local_868._0_8_ - dVar23;
    local_848._8_8_ = (double)local_848._8_8_ - dVar23;
    local_858 = dVar23 + local_858;
    dStack_850 = dVar23 + dStack_850;
    dVar23 = local_818[5] * dVar26;
    local_5d8[0] = local_5d8[0] - dVar23;
    local_5d8[5] = local_5d8[5] - dVar23;
    local_5d8[2] = dVar23 + local_5d8[2];
    local_5d8[3] = dVar23 + local_5d8[3];
    dVar23 = local_818[3] * -dVar28;
    local_590[0xb] = local_590[0xb] - dVar23;
    local_590[0xd] = dVar23 + local_590[0xd];
    local_590[0xe] = dVar23 + local_590[0xe];
    dVar28 = -dVar28 * local_818[2];
    local_4e8 = local_4e8 - dVar28;
    local_4d8 = dVar28 + local_4d8;
    dStack_4d0 = dVar28 + dStack_4d0;
    dStack_4c0 = dStack_4c0 - dVar28;
    dVar26 = dVar26 * local_818[0];
    local_448 = local_448 - dVar26;
    dStack_438 = dVar26 + dStack_438;
    auVar10._8_4_ = SUB84(dVar26 + dStack_430,0);
    auVar10._0_8_ = dStack_438;
    auVar10._12_4_ = (int)((ulong)(dVar26 + dStack_430) >> 0x20);
    dStack_430 = auVar10._8_8_;
    dStack_420 = dStack_420 - dVar26;
    local_308._0_8_ = (double)local_308._0_8_ - dVar27;
    local_2f8 = dVar27 + local_2f8;
    auVar7._8_4_ = SUB84(dVar27 + dStack_2f0,0);
    auVar7._0_8_ = local_2f8;
    auVar7._12_4_ = (int)((ulong)(dVar27 + dStack_2f0) >> 0x20);
    dStack_2f0 = auVar7._8_8_;
    local_2e0 = local_2e0 - dVar27;
    local_798._0_8_ = local_818[2] * local_818[4];
    local_510._0_8_ = (double)local_510._0_8_ - dVar23;
    dVar26 = exp((double)local_7b8._0_8_ * 2.02 + dVar25 * -6743.103321783248);
    dVar28 = local_818[5] * local_818[5];
    local_7a8._0_8_ = (double)local_788._0_8_ * -2.0;
    local_7c8._0_8_ = dVar25 * 2.02 + local_6f8 * 6743.103321783248;
    local_778._0_8_ = dVar26 * 2.97;
    dVar26 = exp((double)local_6c8._0_8_ + (double)local_688._0_8_ + (double)local_7a8._0_8_);
    dVar26 = (double)local_778._0_8_ / dVar26;
    dVar23 = (double)local_778._0_8_ * (double)local_798._0_8_ - dVar28 * dVar26;
    dVar27 = (double)local_7c8._0_8_ * (double)local_778._0_8_ * (double)local_798._0_8_ -
             ((double)local_7c8._0_8_ -
             (((double)local_738._8_8_ + (double)local_738._8_8_) -
             (local_748 + (double)local_738._0_8_)) * dVar25) * dVar26 * dVar28;
    local_858 = local_858 - dVar23;
    local_848._0_8_ = (double)local_848._0_8_ - dVar23;
    local_848._8_8_ = dVar23 + dVar23 + (double)local_848._8_8_;
    dVar28 = local_818[4] * (double)local_778._0_8_;
    local_590[0xd] = local_590[0xd] - dVar28;
    local_590[0xf] = local_590[0xf] - dVar28;
    local_510._0_8_ = dVar28 + dVar28 + (double)local_510._0_8_;
    dVar28 = (double)local_778._0_8_ * local_818[2];
    local_488 = local_488 - dVar28;
    local_478 = local_478 - dVar28;
    dStack_470 = dVar28 + dVar28 + dStack_470;
    dVar26 = dVar26 * -2.0 * local_818[5];
    dStack_438 = dStack_438 - dVar26;
    local_428 = local_428 - dVar26;
    dStack_420 = dVar26 + dVar26 + dStack_420;
    local_2f8 = local_2f8 - dVar27;
    dStack_2e8 = dStack_2e8 - dVar27;
    local_2e0 = dVar27 + dVar27 + local_2e0;
    local_7c8._0_8_ = local_818[3] * local_818[6];
    uVar21 = local_7b8._12_4_;
    dVar26 = local_7b8._0_8_ * 0.0;
    local_7b8._8_4_ = local_7b8._8_4_;
    local_7b8._0_8_ = dVar26;
    local_7b8._12_4_ = uVar21;
    dVar26 = exp(dVar25 * -414.1473159572846 + dVar26);
    local_658._8_4_ = extraout_XMM0_Dc_04;
    local_658._0_8_ = dVar26 * 16600000.0;
    local_658._12_4_ = extraout_XMM0_Dd_04;
    local_798._8_8_ = 0;
    local_798._0_8_ = dVar25 * 0.0;
    local_778._8_8_ = 0;
    local_778._0_8_ = local_6f8 * 414.1473159572846 + dVar25 * 0.0;
    dVar26 = local_818[0] * local_818[1];
    dVar28 = exp((-(double)local_648._0_8_ - local_678) + (double)local_708._0_8_ +
                 (double)local_6b8._0_8_);
    dVar28 = (double)local_658._0_8_ / dVar28;
    dVar23 = (double)local_658._0_8_ * (double)local_7c8._0_8_ - dVar26 * dVar28;
    dVar27 = dVar23 + (double)local_868._8_8_;
    dVar24 = (double)local_778._0_8_ * (double)local_658._0_8_ * (double)local_7c8._0_8_ -
             ((double)local_778._0_8_ -
             ((local_758 + dStack_750) - (local_740 + local_728)) * dVar25) * dVar28 * dVar26;
    local_868._8_4_ = SUB84(dVar27,0);
    local_868._0_8_ = dVar23 + (double)local_868._0_8_;
    local_868._12_4_ = (int)((ulong)dVar27 >> 0x20);
    dStack_850 = dStack_850 - dVar23;
    dVar26 = local_818[1] * -dVar28;
    local_5d8[0] = dVar26 + local_5d8[0];
    local_5d8[1] = dVar26 + local_5d8[1];
    local_5d8[3] = local_5d8[3] - dVar26;
    local_5d8[6] = local_5d8[6] - dVar26;
    dVar26 = -dVar28 * local_818[0];
    local_590[1] = dVar26 + local_590[1];
    local_590[2] = dVar26 + local_590[2];
    local_590[4] = local_590[4] - dVar26;
    local_590[7] = local_590[7] - dVar26;
    dVar26 = (double)local_658._0_8_ * local_818[6];
    local_4e8 = dVar26 + local_4e8;
    dStack_4e0 = dVar26 + dStack_4e0;
    dStack_4d0 = dStack_4d0 - dVar26;
    local_4b8 = local_4b8 - dVar26;
    dVar28 = (double)local_658._0_8_ * local_818[3];
    local_3f8 = dVar28 + local_3f8;
    local_838 = local_838 - dVar23;
    local_3e0 = local_3e0 - dVar28;
    dVar26 = dVar24 + (double)local_308._8_8_;
    local_308._8_4_ = SUB84(dVar26,0);
    local_308._0_8_ = dVar24 + (double)local_308._0_8_;
    local_308._12_4_ = (int)((ulong)dVar26 >> 0x20);
    dStack_2f0 = dStack_2f0 - dVar24;
    dStack_2d8 = dStack_2d8 - dVar24;
    local_7c8._0_8_ = local_818[6] * local_818[3];
    local_3d0._8_8_ = (double)local_3d0._8_8_ - dVar28;
    auStack_3f0._0_8_ = dVar28 + (double)auStack_3f0._0_8_;
    dVar26 = exp(dVar25 * -148.4489164123924 + (double)local_7b8._0_8_);
    local_658._0_8_ = dVar26 * 70790000.0;
    dVar26 = local_6f8 * 148.4489164123924 + (double)local_798._0_8_;
    local_778._0_8_ = local_818[5] * local_818[5];
    dVar28 = exp((double)local_7a8._0_8_ + (double)local_708._0_8_ + (double)local_6b8._0_8_);
    dVar28 = (double)local_658._0_8_ / dVar28;
    dVar23 = (double)local_658._0_8_ * (double)local_7c8._0_8_ - (double)local_778._0_8_ * dVar28;
    dVar27 = dVar26 * (double)local_658._0_8_ * (double)local_7c8._0_8_ -
             (dVar26 - (((double)local_738._8_8_ + (double)local_738._8_8_) -
                       (local_740 + local_728)) * dVar25) * dVar28 * (double)local_778._0_8_;
    dStack_850 = dStack_850 - dVar23;
    dVar26 = (double)local_658._0_8_ * local_818[6];
    dStack_4d0 = dStack_4d0 - dVar26;
    local_838 = local_838 - dVar23;
    local_848._8_8_ = dVar23 + dVar23 + (double)local_848._8_8_;
    local_4b8 = local_4b8 - dVar26;
    dStack_4c0 = dVar26 + dVar26 + dStack_4c0;
    dVar26 = dVar28 * -2.0 * local_818[5];
    dStack_430 = dStack_430 - dVar26;
    dStack_420 = dVar26 + dVar26 + dStack_420;
    local_418 = local_418 - dVar26;
    dVar26 = (double)local_658._0_8_ * local_818[3];
    local_3e0 = local_3e0 - dVar26;
    local_3d0._0_8_ = dVar26 + dVar26 + (double)local_3d0._0_8_;
    local_3d0._8_8_ = (double)local_3d0._8_8_ - dVar26;
    dStack_2f0 = dStack_2f0 - dVar27;
    local_2e0 = dVar27 + dVar27 + local_2e0;
    dStack_2d8 = dStack_2d8 - dVar27;
    local_7a8._0_8_ = local_818[6] * local_818[4];
    local_6a0 = local_6a0 + (double)local_7b8._0_8_;
    dVar26 = exp(local_6a0);
    dVar26 = dVar26 * 32500000.0;
    uVar21 = local_2b8._12_4_;
    local_2b8._8_4_ = local_2b8._8_4_;
    local_2b8._0_8_ = local_2b8._0_8_ + (double)local_798._0_8_;
    local_2b8._12_4_ = uVar21;
    local_7c8._0_8_ = local_818[1] * local_818[5];
    dVar28 = exp((((double)local_6c8._0_8_ - local_678) - (double)local_788._0_8_) +
                 (double)local_6b8._0_8_);
    dVar28 = dVar26 / dVar28;
    dVar27 = dVar26 * (double)local_7a8._0_8_ - (double)local_7c8._0_8_ * dVar28;
    dVar23 = (double)local_2b8._0_8_ * dVar26 * (double)local_7a8._0_8_ -
             ((double)local_2b8._0_8_ -
             ((dStack_750 + (double)local_738._8_8_) - ((double)local_738._0_8_ + local_728)) *
             dVar25) * dVar28 * (double)local_7c8._0_8_;
    local_848._0_8_ = (double)local_848._0_8_ - dVar27;
    local_838 = local_838 - dVar27;
    local_848._8_8_ = dVar27 + (double)local_848._8_8_;
    dVar24 = local_818[1] * -dVar28;
    dVar28 = -dVar28 * local_818[5];
    local_590[2] = local_590[2] + dVar28;
    local_590[5] = local_590[5] - dVar28;
    local_590[6] = local_590[6] + dVar28;
    local_590[7] = local_590[7] - dVar28;
    dVar28 = dVar26 * local_818[6];
    local_490 = local_490 + dVar28;
    local_478 = local_478 - dVar28;
    dStack_470 = dStack_470 + dVar28;
    local_468 = local_468 - dVar28;
    local_440 = local_440 + dVar24;
    local_428 = local_428 - dVar24;
    dStack_420 = dStack_420 + dVar24;
    local_418 = local_418 - dVar24;
    dVar26 = dVar26 * local_818[4];
    auStack_3f0._0_8_ = (double)auStack_3f0._0_8_ + dVar26;
    local_3d8 = local_3d8 - dVar26;
    local_3d0._0_8_ = (double)local_3d0._0_8_ + dVar26;
    local_3d0._8_8_ = (double)local_3d0._8_8_ - dVar26;
    dStack_2e8 = dStack_2e8 - dVar23;
    local_2e0 = local_2e0 + dVar23;
    dStack_2d8 = dStack_2d8 - dVar23;
    local_678 = local_818[5] * local_818[6];
    local_868._8_8_ = (double)local_868._8_8_ + dVar27;
    local_308._8_8_ = (double)local_308._8_8_ + dVar23;
    dVar26 = exp(dVar25 * 250.09868290494586 + (double)local_7b8._0_8_);
    dVar26 = dVar26 * 28900000.0;
    local_7c8._8_8_ = 0;
    local_7c8._0_8_ = local_6f8 * -250.09868290494586 + (double)local_798._0_8_;
    local_7a8._0_8_ = local_818[1] * local_818[2];
    dVar28 = exp(((double)local_6e8._0_8_ - (double)local_688._0_8_) + (double)local_788._0_8_ +
                 (double)local_6b8._0_8_);
    dVar28 = dVar26 / dVar28;
    dVar23 = dVar26 * local_678 - (double)local_7a8._0_8_ * dVar28;
    dVar27 = (double)local_7c8._0_8_ * dVar26 * local_678 -
             ((double)local_7c8._0_8_ -
             ((dStack_750 + local_748) - ((double)local_738._8_8_ + local_728)) * dVar25) * dVar28 *
             (double)local_7a8._0_8_;
    local_868._8_8_ = (double)local_868._8_8_ + dVar23;
    local_858 = local_858 + dVar23;
    local_848._8_8_ = (double)local_848._8_8_ - dVar23;
    local_838 = local_838 - dVar23;
    dVar23 = local_818[2] * -dVar28;
    local_590[2] = local_590[2] + dVar23;
    local_590[3] = local_590[3] + dVar23;
    local_590[6] = local_590[6] - dVar23;
    local_590[7] = local_590[7] - dVar23;
    dVar28 = -dVar28 * local_818[1];
    local_590[0xc] = local_590[0xc] + dVar28;
    local_590[0xd] = local_590[0xd] + dVar28;
    dVar23 = (double)local_510._8_8_ - dVar28;
    local_510._8_4_ = SUB84(dVar23,0);
    local_510._0_8_ = (double)local_510._0_8_ - dVar28;
    local_510._12_4_ = (int)((ulong)dVar23 >> 0x20);
    dVar28 = dVar26 * local_818[6];
    local_440 = local_440 + dVar28;
    auVar11._8_4_ = SUB84(dStack_438 + dVar28,0);
    auVar11._0_8_ = local_440;
    auVar11._12_4_ = (int)((ulong)(dStack_438 + dVar28) >> 0x20);
    dStack_438 = auVar11._8_8_;
    dStack_420 = dStack_420 - dVar28;
    auVar12._8_4_ = SUB84(local_418 - dVar28,0);
    auVar12._0_8_ = dStack_420;
    auVar12._12_4_ = (int)((ulong)(local_418 - dVar28) >> 0x20);
    local_418 = auVar12._8_8_;
    dVar26 = dVar26 * local_818[5];
    dVar28 = (double)auStack_3f0._8_8_ + dVar26;
    auStack_3f0._8_4_ = SUB84(dVar28,0);
    auStack_3f0._0_8_ = (double)auStack_3f0._0_8_ + dVar26;
    auStack_3f0._12_4_ = (int)((ulong)dVar28 >> 0x20);
    dVar28 = (double)local_3d0._8_8_ - dVar26;
    local_3d0._8_4_ = SUB84(dVar28,0);
    local_3d0._0_8_ = (double)local_3d0._0_8_ - dVar26;
    local_3d0._12_4_ = (int)((ulong)dVar28 >> 0x20);
    local_308._8_8_ = (double)local_308._8_8_ + dVar27;
    local_2f8 = local_2f8 + dVar27;
    local_2e0 = local_2e0 - dVar27;
    auVar8._8_4_ = SUB84(dStack_2d8 - dVar27,0);
    auVar8._0_8_ = local_2e0;
    auVar8._12_4_ = (int)((ulong)(dStack_2d8 - dVar27) >> 0x20);
    dStack_2d8 = auVar8._8_8_;
    local_7a8._0_8_ = local_818[6] * local_818[6];
    local_778._0_8_ = exp(dVar25 * -6029.542089672155 + (double)local_7b8._0_8_);
    local_778._0_8_ = (double)local_778._0_8_ * 420000000.0;
    dVar26 = local_6f8 * 6029.542089672155 + (double)local_798._0_8_;
    local_678 = ((double)local_6b8._0_8_ + (double)local_6b8._0_8_ + (double)local_6e8._0_8_) -
                (double)local_668._0_8_;
    local_7c8._0_8_ = local_818[1] * local_818[7];
    dVar28 = exp(local_678);
    dVar28 = (double)local_778._0_8_ / dVar28;
    dVar23 = (double)local_778._0_8_ * (double)local_7a8._0_8_ - (double)local_7c8._0_8_ * dVar28;
    dVar27 = dVar26 * (double)local_778._0_8_ * (double)local_7a8._0_8_ -
             (dVar26 - ((dStack_750 + dStack_720) - (local_728 + local_728)) * dVar25) * dVar28 *
             (double)local_7c8._0_8_;
    local_868._8_8_ = (double)local_868._8_8_ + dVar23;
    local_838 = local_838 - (dVar23 + dVar23);
    dStack_830 = dVar23 + dStack_830;
    dVar26 = local_818[7] * -dVar28;
    local_590[2] = local_590[2] + dVar26;
    local_590[7] = local_590[7] - (dVar26 + dVar26);
    local_590[8] = dVar26 + local_590[8];
    dVar23 = ((double)local_778._0_8_ + (double)local_778._0_8_) * local_818[6];
    local_3c0 = dVar23 + local_3c0;
    dVar26 = -dVar28 * local_818[1];
    local_3a0 = local_3a0 + dVar26;
    dStack_378 = dStack_378 - (dVar26 + dVar26);
    local_370 = dVar26 + local_370;
    local_308._8_8_ = (double)local_308._8_8_ + dVar27;
    dStack_2d8 = dStack_2d8 - (dVar27 + dVar27);
    local_2d0 = dVar27 + local_2d0;
    local_7a8._0_8_ = local_818[6] * local_818[6];
    auStack_3f0._0_8_ = (double)auStack_3f0._0_8_ + dVar23;
    local_3d0._8_8_ = (double)local_3d0._8_8_ - (dVar23 + dVar23);
    dVar26 = exp(dVar25 * 819.8909135956303 + (double)local_7b8._0_8_);
    dVar26 = dVar26 * 130000.0;
    local_7c8._0_8_ = local_6f8 * -819.8909135956303 + (double)local_798._0_8_;
    local_6e8._0_8_ = local_818[1] * local_818[7];
    dVar28 = exp(local_678);
    dVar28 = dVar26 / dVar28;
    dVar23 = dVar26 * (double)local_7a8._0_8_ - (double)local_6e8._0_8_ * dVar28;
    local_868._8_8_ = (double)local_868._8_8_ + dVar23;
    local_838 = local_838 - (dVar23 + dVar23);
    local_818[1] = local_818[1] * -dVar28;
    dVar27 = -dVar28 * local_818[7];
    local_590[2] = local_590[2] + dVar27;
    local_590[7] = local_590[7] - (dVar27 + dVar27);
    dStack_830 = dVar23 + dStack_830;
    local_590[8] = dVar27 + local_590[8];
    dVar23 = (dVar26 + dVar26) * local_818[6];
    auStack_3f0._0_8_ = (double)auStack_3f0._0_8_ + dVar23;
    local_3d0._8_8_ = (double)local_3d0._8_8_ - (dVar23 + dVar23);
    local_3c0 = dVar23 + local_3c0;
    local_3a0 = local_3a0 + local_818[1];
    dStack_378 = dStack_378 - (local_818[1] + local_818[1]);
    local_370 = local_818[1] + local_370;
    dVar26 = (double)local_7c8._0_8_ * dVar26 * (double)local_7a8._0_8_ -
             ((double)local_7c8._0_8_ -
             ((dStack_750 + dStack_720) - (local_728 + local_728)) * dVar25) * dVar28 *
             (double)local_6e8._0_8_;
    local_308._8_8_ = (double)local_308._8_8_ + dVar26;
    dStack_2d8 = dStack_2d8 - (dVar26 + dVar26);
    local_2d0 = dVar26 + local_2d0;
    local_6e8._0_8_ = local_818[7] * local_818[3];
    local_7a8._0_8_ = dVar25 * -1997.7701632447386;
    dVar26 = exp((double)local_7b8._0_8_ + dVar25 * -1997.7701632447386);
    local_778._0_8_ = dVar26 * 24100000.0;
    local_678 = local_6f8 * 1997.7701632447386;
    dVar28 = local_798._0_8_ + local_678;
    local_7c8._0_8_ = local_818[2] * local_818[5];
    dVar26 = exp(((double)local_6d8._0_8_ - (double)local_788._0_8_) + (double)local_668._0_8_);
    dVar26 = (double)local_778._0_8_ / dVar26;
    dVar23 = (double)local_778._0_8_ * (double)local_6e8._0_8_ - (double)local_7c8._0_8_ * dVar26;
    local_858 = local_858 + dVar23;
    dStack_850 = dStack_850 - dVar23;
    dStack_830 = dStack_830 - dVar23;
    local_848._8_8_ = dVar23 + (double)local_848._8_8_;
    dVar27 = dVar28 * (double)local_778._0_8_ * (double)local_6e8._0_8_ -
             (dVar28 - ((local_748 + (double)local_738._8_8_) - (local_740 + dStack_720)) * dVar25)
             * dVar26 * (double)local_7c8._0_8_;
    dVar28 = local_818[5] * -dVar26;
    local_590[0xd] = local_590[0xd] + dVar28;
    local_590[0xe] = local_590[0xe] - dVar28;
    local_500 = local_500 - dVar28;
    dVar23 = (double)local_778._0_8_ * local_818[7];
    local_4d8 = local_4d8 + dVar23;
    dStack_4d0 = dStack_4d0 - dVar23;
    dStack_4c0 = dStack_4c0 + dVar23;
    local_4b0 = local_4b0 - dVar23;
    dVar26 = -dVar26 * local_818[2];
    dStack_438 = dStack_438 + dVar26;
    dStack_430 = dStack_430 - dVar26;
    dStack_420 = dStack_420 + dVar26;
    local_410 = local_410 - dVar26;
    dVar26 = (double)local_778._0_8_ * local_818[3];
    local_398 = local_398 + dVar26;
    local_390 = local_390 - dVar26;
    local_380 = local_380 + dVar26;
    local_370 = local_370 - dVar26;
    local_2f8 = local_2f8 + dVar27;
    dStack_2f0 = dStack_2f0 - dVar27;
    local_2e0 = local_2e0 + dVar27;
    local_2d0 = local_2d0 - dVar27;
    local_6e8._0_8_ = local_818[7] * local_818[3];
    local_510._0_8_ = (double)local_510._0_8_ + dVar28;
    dVar26 = exp(dVar25 * -4000.5724931475243 + (double)local_7b8._0_8_);
    dVar26 = dVar26 * 48200000.0;
    local_6d8._0_8_ = local_818[0] * local_818[6];
    local_7c8._0_8_ = local_6f8 * 4000.5724931475243 + (double)local_798._0_8_;
    dVar28 = exp((((double)local_708._0_8_ - (double)local_648._0_8_) - (double)local_6b8._0_8_) +
                 (double)local_668._0_8_);
    dVar28 = dVar26 / dVar28;
    dVar23 = dVar26 * (double)local_6e8._0_8_ - (double)local_6d8._0_8_ * dVar28;
    dVar27 = (double)local_7c8._0_8_ * dVar26 * (double)local_6e8._0_8_ -
             ((double)local_7c8._0_8_ -
             ((local_758 + local_728) - (local_740 + dStack_720)) * dVar25) * dVar28 *
             (double)local_6d8._0_8_;
    local_868._0_8_ = (double)local_868._0_8_ + dVar23;
    dStack_850 = dStack_850 - dVar23;
    dStack_830 = dStack_830 - dVar23;
    local_838 = dVar23 + local_838;
    dVar23 = local_818[6] * -dVar28;
    local_5d8[0] = local_5d8[0] + dVar23;
    local_5d8[3] = local_5d8[3] - dVar23;
    local_5d8[6] = local_5d8[6] + dVar23;
    local_5d8[7] = local_5d8[7] - dVar23;
    dVar23 = dVar26 * local_818[7];
    local_4e8 = local_4e8 + dVar23;
    dStack_4d0 = dStack_4d0 - dVar23;
    local_4b8 = local_4b8 + dVar23;
    local_4b0 = local_4b0 - dVar23;
    local_818[0] = -dVar28 * local_818[0];
    local_3f8 = local_3f8 + local_818[0];
    local_3e0 = local_3e0 - local_818[0];
    local_3d0._8_8_ = (double)local_3d0._8_8_ + local_818[0];
    local_3c0 = local_3c0 - local_818[0];
    dVar26 = dVar26 * local_818[3];
    local_3a8 = local_3a8 + dVar26;
    local_390 = local_390 - dVar26;
    dStack_378 = dStack_378 + dVar26;
    local_370 = local_370 - dVar26;
    local_308._0_8_ = (double)local_308._0_8_ + dVar27;
    dStack_2f0 = dStack_2f0 - dVar27;
    dStack_2d8 = dStack_2d8 + dVar27;
    local_2d0 = local_2d0 - dVar27;
    local_708._0_8_ = local_818[7] * local_818[4];
    dVar26 = exp((double)local_698._0_8_ + (double)local_7a8._0_8_);
    local_7a8._8_4_ = extraout_XMM0_Dc_05;
    local_7a8._0_8_ = dVar26 * 9.55;
    local_7a8._12_4_ = extraout_XMM0_Dd_05;
    uVar21 = local_768._12_4_;
    local_768._8_4_ = local_768._8_4_;
    local_768._0_8_ = local_768._0_8_ + local_678;
    local_768._12_4_ = uVar21;
    local_648._0_8_ = local_818[5] * local_818[6];
    dVar26 = exp((((double)local_6c8._0_8_ - (double)local_788._0_8_) - (double)local_6b8._0_8_) +
                 (double)local_668._0_8_);
    dVar26 = (double)local_7a8._0_8_ / dVar26;
    dVar28 = (double)local_7a8._0_8_ * (double)local_708._0_8_ - (double)local_648._0_8_ * dVar26;
    dVar23 = (double)local_768._0_8_ * (double)local_7a8._0_8_ * (double)local_708._0_8_ -
             ((double)local_768._0_8_ -
             (((double)local_738._8_8_ + local_728) - ((double)local_738._0_8_ + dStack_720)) *
             dVar25) * dVar26 * (double)local_648._0_8_;
    local_848._0_8_ = (double)local_848._0_8_ - dVar28;
    local_848._8_8_ = dVar28 + (double)local_848._8_8_;
    local_838 = dVar28 + local_838;
    dStack_830 = dStack_830 - dVar28;
    dVar28 = (double)local_7a8._0_8_ * local_818[7];
    local_478 = local_478 - dVar28;
    dStack_470 = dVar28 + dStack_470;
    local_468 = dVar28 + local_468;
    local_460 = local_460 - dVar28;
    dVar28 = local_818[6] * -dVar26;
    local_428 = local_428 - dVar28;
    dStack_420 = dVar28 + dStack_420;
    local_418 = dVar28 + local_418;
    local_410 = local_410 - dVar28;
    dVar26 = -dVar26 * local_818[5];
    local_3d8 = local_3d8 - dVar26;
    local_3d0._0_8_ = dVar26 + (double)local_3d0._0_8_;
    local_3d0._8_8_ = dVar26 + (double)local_3d0._8_8_;
    local_3c0 = local_3c0 - dVar26;
    local_818[4] = (double)local_7a8._0_8_ * local_818[4];
    local_388 = local_388 - local_818[4];
    local_380 = local_818[4] + local_380;
    dStack_378 = local_818[4] + dStack_378;
    local_370 = local_370 - local_818[4];
    dStack_2e8 = dStack_2e8 - dVar23;
    local_2e0 = dVar23 + local_2e0;
    dStack_2d8 = dVar23 + dStack_2d8;
    local_2d0 = local_2d0 - dVar23;
    local_6c8._0_8_ = local_818[7] * local_818[5];
    dVar26 = exp(local_6a0);
    local_648._0_8_ = dVar26 * 1000000.0;
    local_708._0_8_ = local_818[2] * local_818[6];
    uVar21 = local_788._12_4_;
    dVar26 = ((local_788._0_8_ - (double)local_688._0_8_) - (double)local_6b8._0_8_) +
             (double)local_668._0_8_;
    local_788._8_4_ = local_788._8_4_;
    local_788._0_8_ = dVar26;
    local_788._12_4_ = uVar21;
    dVar26 = exp(dVar26);
    dVar26 = (double)local_648._0_8_ / dVar26;
    dVar28 = (double)local_648._0_8_ * (double)local_6c8._0_8_ - (double)local_708._0_8_ * dVar26;
    dVar23 = (double)local_2b8._0_8_ * (double)local_648._0_8_ * (double)local_6c8._0_8_ -
             ((double)local_2b8._0_8_ -
             ((local_748 + local_728) - ((double)local_738._8_8_ + dStack_720)) * dVar25) * dVar26 *
             (double)local_708._0_8_;
    local_858 = local_858 + dVar28;
    local_848._8_8_ = (double)local_848._8_8_ - dVar28;
    dStack_830 = dStack_830 - dVar28;
    local_838 = dVar28 + local_838;
    dVar28 = local_818[6] * -dVar26;
    local_590[0xd] = local_590[0xd] + dVar28;
    local_510._0_8_ = (double)local_510._0_8_ - dVar28;
    local_510._8_8_ = (double)local_510._8_8_ + dVar28;
    local_500 = local_500 - dVar28;
    local_6b8._0_8_ = local_818[7];
    dVar28 = (double)local_648._0_8_ * local_818[7];
    dStack_438 = dStack_438 + dVar28;
    dStack_420 = dStack_420 - dVar28;
    local_418 = local_418 + dVar28;
    local_410 = local_410 - dVar28;
    dVar26 = -dVar26 * local_818[2];
    auStack_3f0._8_8_ = (double)auStack_3f0._8_8_ + dVar26;
    local_3d0._0_8_ = (double)local_3d0._0_8_ - dVar26;
    local_3d0._8_8_ = (double)local_3d0._8_8_ + dVar26;
    local_3c0 = local_3c0 - dVar26;
    local_6c8._0_8_ = local_818[5];
    dVar26 = (double)local_648._0_8_ * local_818[5];
    local_398 = local_398 + dVar26;
    local_380 = local_380 - dVar26;
    dStack_378 = dStack_378 + dVar26;
    local_370 = local_370 - dVar26;
    local_2f8 = local_2f8 + dVar23;
    local_2e0 = local_2e0 - dVar23;
    dStack_2d8 = dStack_2d8 + dVar23;
    local_2d0 = local_2d0 - dVar23;
    local_708._0_8_ = exp(dVar25 * -4809.241675095709 + (double)local_7b8._0_8_);
    local_7b8._0_8_ = local_818[2] * local_818[6];
    dVar26 = exp((double)local_788._0_8_);
    dVar28 = (double)local_708._0_8_ * 580000000.0;
    dVar27 = local_6f8 * 4809.241675095709 + (double)local_798._0_8_;
    dVar26 = dVar28 / dVar26;
    dVar23 = dVar28 * (double)local_6b8._0_8_ * (double)local_6c8._0_8_ -
             (double)local_7b8._0_8_ * dVar26;
    local_858 = local_858 + dVar23;
    local_848._8_8_ = (double)local_848._8_8_ - dVar23;
    dVar27 = dVar27 * dVar28 * (double)local_6b8._0_8_ * (double)local_6c8._0_8_ -
             (dVar27 - ((local_748 + local_728) - ((double)local_738._8_8_ + dStack_720)) * dVar25)
             * dVar26 * (double)local_7b8._0_8_;
    local_838 = dVar23 + local_838;
    dStack_830 = dStack_830 - dVar23;
    local_818[6] = local_818[6] * -dVar26;
    local_590[0xd] = local_590[0xd] + local_818[6];
    local_510._8_8_ = (double)local_510._8_8_ + local_818[6];
    local_510._0_8_ = (double)local_510._0_8_ - local_818[6];
    local_500 = local_500 - local_818[6];
    local_818[7] = local_818[7] * dVar28;
    dStack_438 = dStack_438 + local_818[7];
    dStack_420 = dStack_420 - local_818[7];
    local_418 = local_418 + local_818[7];
    local_818[2] = -dVar26 * local_818[2];
    local_410 = local_410 - local_818[7];
    auStack_3f0._8_8_ = (double)auStack_3f0._8_8_ + local_818[2];
    local_3d0._8_8_ = (double)local_3d0._8_8_ + local_818[2];
    local_3d0._0_8_ = (double)local_3d0._0_8_ - local_818[2];
    local_3c0 = local_3c0 - local_818[2];
    dVar28 = dVar28 * local_818[5];
    local_398 = local_398 + dVar28;
    local_380 = local_380 - dVar28;
    dStack_378 = dStack_378 + dVar28;
    local_370 = local_370 - dVar28;
    local_2f8 = local_2f8 + dVar27;
    local_2e0 = local_2e0 - dVar27;
    dStack_2d8 = dStack_2d8 + dVar27;
    local_2d0 = local_2d0 - dVar27;
    if (local_28c == 2) {
      local_208[3] = local_1a8 * 0.0 + local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 2.5;
      if (1000.0 <= local_288) {
        local_208[0] = local_1a8 * 1.58275179e-15 +
                       local_188 * -9.23157818e-12 +
                       local_198 * -5.63382869e-08 + local_288 * 0.000700064411 + 2.99142337;
        local_208[1] = local_1a8 * -1.13643531e-15 +
                       local_188 * 1.77528148e-11 +
                       local_198 * -1.25884199e-07 + local_288 * 0.000613519689 + 3.69757819;
        local_208[2] = local_1a8 * -6.39161787e-15 +
                       local_188 * 1.20099639e-10 +
                       local_198 * -8.73026011e-07 + local_288 * 0.00305629289 + 2.67214561;
        local_208[4] = local_1a8 * -4.3680515e-16 +
                       local_188 * 4.55106742e-12 +
                       local_198 * -3.10280335e-09 + local_288 * -2.75506191e-05 + 2.54205966;
        local_208[5] = local_1a8 * -1.33195876e-15 +
                       local_188 * 3.05218674e-11 +
                       local_198 * -2.59082758e-07 + local_288 * 0.00105650448 + 2.86472886;
        local_208[6] = local_1a8 * -1.07908535e-14 +
                       local_188 * 1.1424637e-10 +
                       local_198 * -6.3365815e-07 + local_288 * 0.00223982013 + 4.0172109;
        local_208[7] = local_1a8 * -1.43165356e-14 +
                       local_188 * 2.34890357e-10 +
                       local_198 * -1.47468882e-06 + local_288 * 0.00433613639 + 4.57316685;
        dVar26 = local_188 * 1.009704e-10 +
                 local_198 * -5.684761e-07 + local_288 * 0.001487977 + 2.92664;
        dVar28 = local_1a8 * -6.753351e-15;
      }
      else {
        local_208[0] = local_1a8 * 4.13487224e-13 +
                       local_188 * -9.47543433e-11 +
                       local_198 * -8.14301529e-07 + local_288 * 0.000824944174 + 3.29812431;
        local_208[1] = local_1a8 * -8.76855392e-13 +
                       local_188 * 1.31387723e-09 +
                       local_198 * -5.75615047e-07 + local_288 * 0.00112748635 + 3.2129364;
        local_208[2] = local_1a8 * -2.50658847e-12 +
                       local_188 * 6.96858127e-09 +
                       local_198 * -6.35469633e-06 + local_288 * 0.00347498246 + 3.38684249;
        local_208[4] = local_1a8 * 3.89069636e-13 +
                       local_188 * -1.60284319e-09 +
                       local_198 * 2.4210317e-06 + local_288 * -0.00163816649 + 2.94642878;
        local_208[5] = local_1a8 * 2.06237379e-12 +
                       local_188 * -5.79853643e-09 +
                       local_198 * 6.52764691e-06 + local_288 * -0.00322544939 + 4.12530561;
        local_208[6] = local_1a8 * 9.29225124e-12 +
                       local_188 * -2.42763894e-08 +
                       local_198 * 2.11582891e-05 + local_288 * -0.00474912051 + 4.30179801;
        local_208[7] = local_1a8 * 2.47151475e-12 +
                       local_188 * -4.62580552e-09 +
                       local_198 * -1.48501258e-07 + local_288 * 0.00656922581 + 3.38875365;
        dVar26 = local_188 * 5.641515e-09 +
                 local_198 * -3.963222e-06 + local_288 * 0.00140824 + 3.298677;
        dVar28 = local_1a8 * -2.444855e-12;
      }
      pdVar17 = local_218;
      local_208[8] = dVar28 + dVar26;
      local_258[3] = local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 0.0;
      if (1000.0 <= local_288) {
        local_258[0] = local_188 * 6.33100716e-15 +
                       local_198 * -2.76947345e-11 + local_288 * -1.12676574e-07 + 0.000700064411;
        local_258[1] = local_188 * -4.54574124e-15 +
                       local_198 * 5.32584444e-11 + local_288 * -2.51768398e-07 + 0.000613519689;
        local_258[2] = local_188 * -2.55664715e-14 +
                       local_198 * 3.60298917e-10 + local_288 * -1.74605202e-06 + 0.00305629289;
        dVar26 = local_188 * -5.32783504e-15 +
                 local_198 * 9.15656022e-11 + local_288 * -5.18165516e-07 + 0.00105650448;
        local_238._8_4_ = SUB84(dVar26,0);
        local_238._0_8_ =
             local_188 * -1.7472206e-15 +
             local_198 * 1.36532023e-11 + local_288 * -6.2056067e-09 + -2.75506191e-05;
        local_238._12_4_ = (int)((ulong)dVar26 >> 0x20);
        local_228 = local_188 * -4.3163414e-14 +
                    local_198 * 3.4273911e-10 + local_288 * -1.2673163e-06 + 0.00223982013;
        dStack_220 = local_188 * -5.72661424e-14 +
                     local_198 * 7.04671071e-10 + local_288 * -2.94937764e-06 + 0.00433613639;
        dVar26 = local_198 * 3.029112e-10 + local_288 * -1.1369522e-06 + 0.001487977;
        dVar28 = local_188 * -2.7013404e-14;
      }
      else {
        local_258[0] = local_188 * 1.6539489e-12 +
                       local_198 * -2.8426303e-10 + local_288 * -1.62860306e-06 + 0.000824944174;
        local_258[1] = local_188 * -3.50742157e-12 +
                       local_198 * 3.94163169e-09 + local_288 * -1.15123009e-06 + 0.00112748635;
        local_258[2] = local_188 * -1.00263539e-11 +
                       local_198 * 2.09057438e-08 + local_288 * -1.27093927e-05 + 0.00347498246;
        dVar26 = local_188 * 8.24949516e-12 +
                 local_198 * -1.73956093e-08 + local_288 * 1.30552938e-05 + -0.00322544939;
        local_238._8_4_ = SUB84(dVar26,0);
        local_238._0_8_ =
             local_188 * 1.55627854e-12 +
             local_198 * -4.80852957e-09 + local_288 * 4.8420634e-06 + -0.00163816649;
        local_238._12_4_ = (int)((ulong)dVar26 >> 0x20);
        local_228 = local_188 * 3.7169005e-11 +
                    local_198 * -7.28291682e-08 + local_288 * 4.23165782e-05 + -0.00474912051;
        dStack_220 = local_188 * 9.886059e-12 +
                     local_198 * -1.38774166e-08 + local_288 * -2.97002516e-07 + 0.00656922581;
        dVar26 = local_198 * 1.6924545e-08 + local_288 * -7.926444e-06 + 0.00140824;
        dVar28 = local_188 * -9.77942e-12;
      }
      dVar28 = dVar28 + dVar26;
      pdVar16 = &local_758;
    }
    else {
      local_208[3] = local_1a8 * 0.0 + local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 1.5;
      if (1000.0 <= local_288) {
        local_208[0] = local_1a8 * 1.58275179e-15 +
                       local_188 * -9.23157818e-12 +
                       local_198 * -5.63382869e-08 + local_288 * 0.000700064411 + 1.99142337;
        local_208[1] = local_1a8 * -1.13643531e-15 +
                       local_188 * 1.77528148e-11 +
                       local_198 * -1.25884199e-07 + local_288 * 0.000613519689 + 2.69757819;
        local_208[2] = local_1a8 * -6.39161787e-15 +
                       local_188 * 1.20099639e-10 +
                       local_198 * -8.73026011e-07 + local_288 * 0.00305629289 + 1.67214561;
        local_208[4] = local_1a8 * -4.3680515e-16 +
                       local_188 * 4.55106742e-12 +
                       local_198 * -3.10280335e-09 + local_288 * -2.75506191e-05 + 1.54205966;
        local_208[5] = local_1a8 * -1.33195876e-15 +
                       local_188 * 3.05218674e-11 +
                       local_198 * -2.59082758e-07 + local_288 * 0.00105650448 + 1.86472886;
        local_208[6] = local_1a8 * -1.07908535e-14 +
                       local_188 * 1.1424637e-10 +
                       local_198 * -6.3365815e-07 + local_288 * 0.00223982013 + 3.0172109;
        local_208[7] = local_1a8 * -1.43165356e-14 +
                       local_188 * 2.34890357e-10 +
                       local_198 * -1.47468882e-06 + local_288 * 0.00433613639 + 3.57316685;
        dVar26 = local_188 * 1.009704e-10 +
                 local_198 * -5.684761e-07 + local_288 * 0.001487977 + 1.92664;
        uVar21 = 0x668d1fd9;
        uVar22 = 0xbcfe6a15;
      }
      else {
        local_208[0] = local_1a8 * 4.13487224e-13 +
                       local_188 * -9.47543433e-11 +
                       local_198 * -8.14301529e-07 + local_288 * 0.000824944174 + 2.29812431;
        local_208[1] = local_1a8 * -8.76855392e-13 +
                       local_188 * 1.31387723e-09 +
                       local_198 * -5.75615047e-07 + local_288 * 0.00112748635 + 2.2129364;
        local_208[2] = local_1a8 * -2.50658847e-12 +
                       local_188 * 6.96858127e-09 +
                       local_198 * -6.35469633e-06 + local_288 * 0.00347498246 + 2.38684249;
        local_208[4] = local_1a8 * 3.89069636e-13 +
                       local_188 * -1.60284319e-09 +
                       local_198 * 2.4210317e-06 + local_288 * -0.00163816649 + 1.94642878;
        local_208[5] = local_1a8 * 2.06237379e-12 +
                       local_188 * -5.79853643e-09 +
                       local_198 * 6.52764691e-06 + local_288 * -0.00322544939 + 3.12530561;
        local_208[6] = local_1a8 * 9.29225124e-12 +
                       local_188 * -2.42763894e-08 +
                       local_198 * 2.11582891e-05 + local_288 * -0.00474912051 + 3.30179801;
        local_208[7] = local_1a8 * 2.47151475e-12 +
                       local_188 * -4.62580552e-09 +
                       local_198 * -1.48501258e-07 + local_288 * 0.00656922581 + 2.38875365;
        dVar26 = local_188 * 5.641515e-09 +
                 local_198 * -3.963222e-06 + local_288 * 0.00140824 + 2.298677;
        uVar21 = 0xf3dbcf65;
        uVar22 = 0xbd858152;
      }
      local_208[8] = (double)CONCAT44(uVar22,uVar21) * local_1a8 + dVar26;
      local_258[3] = local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 0.0;
      if (1000.0 <= local_288) {
        local_258[0] = local_188 * 6.33100716e-15 +
                       local_198 * -2.76947345e-11 + local_288 * -1.12676574e-07 + 0.000700064411;
        local_258[1] = local_188 * -4.54574124e-15 +
                       local_198 * 5.32584444e-11 + local_288 * -2.51768398e-07 + 0.000613519689;
        local_258[2] = local_188 * -2.55664715e-14 +
                       local_198 * 3.60298917e-10 + local_288 * -1.74605202e-06 + 0.00305629289;
        dVar26 = local_188 * -5.32783504e-15 +
                 local_198 * 9.15656022e-11 + local_288 * -5.18165516e-07 + 0.00105650448;
        local_238._8_4_ = SUB84(dVar26,0);
        local_238._0_8_ =
             local_188 * -1.7472206e-15 +
             local_198 * 1.36532023e-11 + local_288 * -6.2056067e-09 + -2.75506191e-05;
        local_238._12_4_ = (int)((ulong)dVar26 >> 0x20);
        local_228 = local_188 * -4.3163414e-14 +
                    local_198 * 3.4273911e-10 + local_288 * -1.2673163e-06 + 0.00223982013;
        dStack_220 = local_188 * -5.72661424e-14 +
                     local_198 * 7.04671071e-10 + local_288 * -2.94937764e-06 + 0.00433613639;
        dVar26 = local_198 * 3.029112e-10 + local_288 * -1.1369522e-06 + 0.001487977;
        uVar21 = 0x668d1fd9;
        uVar22 = 0xbd1e6a15;
      }
      else {
        local_258[0] = local_188 * 1.6539489e-12 +
                       local_198 * -2.8426303e-10 + local_288 * -1.62860306e-06 + 0.000824944174;
        local_258[1] = local_188 * -3.50742157e-12 +
                       local_198 * 3.94163169e-09 + local_288 * -1.15123009e-06 + 0.00112748635;
        local_258[2] = local_188 * -1.00263539e-11 +
                       local_198 * 2.09057438e-08 + local_288 * -1.27093927e-05 + 0.00347498246;
        dVar26 = local_188 * 8.24949516e-12 +
                 local_198 * -1.73956093e-08 + local_288 * 1.30552938e-05 + -0.00322544939;
        local_238._8_4_ = SUB84(dVar26,0);
        local_238._0_8_ =
             local_188 * 1.55627854e-12 +
             local_198 * -4.80852957e-09 + local_288 * 4.8420634e-06 + -0.00163816649;
        local_238._12_4_ = (int)((ulong)dVar26 >> 0x20);
        local_228 = local_188 * 3.7169005e-11 +
                    local_198 * -7.28291682e-08 + local_288 * 4.23165782e-05 + -0.00474912051;
        dStack_220 = local_188 * 9.886059e-12 +
                     local_198 * -1.38774166e-08 + local_288 * -2.97002516e-07 + 0.00656922581;
        dVar26 = local_198 * 1.6924545e-08 + local_288 * -7.926444e-06 + 0.00140824;
        uVar21 = 0xf3dbcf65;
        uVar22 = 0xbda58152;
      }
      local_218[0] = (double)CONCAT44(uVar22,uVar21) * local_188 + dVar26;
      local_60 = local_260 +
                 local_1a8 * 0.0 + local_188 * 0.0 + local_198 * 0.0 + local_288 * 0.0 + 1.5;
      if (1000.0 <= local_288) {
        local_78 = dVar25 * -835.033997 +
                   local_1a8 * 3.16550358e-16 +
                   local_188 * -2.30789455e-12 +
                   local_198 * -1.8779429e-08 + local_288 * 0.000350032206 + 1.99142337;
        dStack_70 = dVar25 * -1233.93018 +
                    local_1a8 * -2.27287062e-16 +
                    local_188 * 4.4382037e-12 +
                    local_198 * -4.19613997e-08 + local_288 * 0.000306759845 + 2.69757819;
        local_68 = dVar25 * -29899.209 +
                   local_1a8 * -1.27832357e-15 +
                   local_188 * 3.00249098e-11 +
                   local_198 * -2.9100867e-07 + local_288 * 0.00152814644 + 1.67214561;
        local_58 = dVar25 * 29230.8027 +
                   local_1a8 * -8.736103e-17 +
                   local_188 * 1.13776685e-12 +
                   local_198 * -1.03426778e-09 + local_288 * -1.37753096e-05 + 1.54205966;
        dStack_50 = dVar25 * 3683.62875 +
                    local_1a8 * -2.66391752e-16 +
                    local_188 * 7.63046685e-12 +
                    local_198 * -8.63609193e-08 + local_288 * 0.00052825224 + 1.86472886;
        local_48 = dVar25 * 111.856713 +
                   local_1a8 * -2.1581707e-15 +
                   local_188 * 2.85615925e-11 +
                   local_198 * -2.11219383e-07 + local_288 * 0.00111991006 + 3.0172109;
        dStack_40 = dVar25 * -18006.9609 +
                    local_1a8 * -2.86330712e-15 +
                    local_188 * 5.87225893e-11 +
                    local_198 * -4.9156294e-07 + local_288 * 0.0021680682 + 3.57316685;
        dVar28 = local_1a8 * -1.3506702e-15 +
                 local_188 * 2.52426e-11 +
                 local_198 * -1.89492033e-07 + local_288 * 0.0007439885 + 1.92664;
        dVar26 = -922.7977;
      }
      else {
        local_78 = dVar25 * -1012.52087 +
                   local_1a8 * 8.26974448e-14 +
                   local_188 * -2.36885858e-11 +
                   local_198 * -2.71433843e-07 + local_288 * 0.000412472087 + 2.29812431;
        dStack_70 = dVar25 * -1005.24902 +
                    local_1a8 * -1.75371078e-13 +
                    local_188 * 3.28469308e-10 +
                    local_198 * -1.91871682e-07 + local_288 * 0.000563743175 + 2.2129364;
        local_68 = dVar25 * -30208.1133 +
                   local_1a8 * -5.01317694e-13 +
                   local_188 * 1.74214532e-09 +
                   local_198 * -2.11823211e-06 + local_288 * 0.00173749123 + 2.38684249;
        local_58 = dVar25 * 29147.6445 +
                   local_1a8 * 7.78139272e-14 +
                   local_188 * -4.00710797e-10 +
                   local_198 * 8.07010567e-07 + local_288 * -0.000819083245 + 1.94642878;
        dStack_50 = dVar25 * 3346.30913 +
                    local_1a8 * 4.12474758e-13 +
                    local_188 * -1.44963411e-09 +
                    local_198 * 2.1758823e-06 + local_288 * -0.0016127247 + 3.12530561;
        local_48 = dVar25 * 294.80804 +
                   local_1a8 * 1.85845025e-12 +
                   local_188 * -6.06909735e-09 +
                   local_198 * 7.05276303e-06 + local_288 * -0.00237456025 + 3.30179801;
        dStack_40 = dVar25 * -17663.1465 +
                    local_1a8 * 4.9430295e-13 +
                    local_188 * -1.15645138e-09 +
                    local_198 * -4.95004193e-08 + local_288 * 0.0032846129 + 2.38875365;
        dVar28 = local_1a8 * -4.88971e-13 +
                 local_188 * 1.41037875e-09 +
                 local_198 * -1.321074e-06 + local_288 * 0.00070412 + 2.298677;
        dVar26 = -1020.9;
      }
      pdVar16 = &local_78;
      dVar28 = dVar26 * dVar25 + dVar28;
      pdVar17 = &local_38;
    }
    *pdVar17 = dVar28;
    dVar28 = 0.0;
    dVar23 = 0.0;
    dVar26 = 0.0;
    lVar18 = 0;
    dVar27 = 0.0;
    do {
      dVar27 = dVar27 + *(double *)((long)local_208 + lVar18) *
                        *(double *)((long)local_818 + lVar18);
      dVar24 = *(double *)((long)pdVar16 + lVar18);
      dVar28 = dVar28 + *(double *)((long)local_818 + lVar18) *
                        *(double *)((long)local_258 + lVar18);
      dVar23 = dVar23 + *(double *)(local_868 + lVar18) * dVar24;
      dVar26 = dVar26 + (*(double *)((long)local_208 + lVar18) - dVar24) * dVar25 *
                        *(double *)(local_868 + lVar18) + dVar24 * *(double *)(local_308 + lVar18);
      lVar18 = lVar18 + 8;
    } while (lVar18 != 0x48);
    dVar23 = dVar23 * (1.0 / dVar27);
    dVar27 = local_288 * (1.0 / dVar27);
    dVar25 = dVar23 * dVar27;
    pdVar17 = local_5d8;
    lVar18 = 0;
    do {
      dVar24 = 0.0;
      lVar19 = 0;
      do {
        dVar24 = dVar24 + pdVar16[lVar19] * pdVar17[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 9);
      local_590[lVar18 * 10] = local_208[lVar18] * dVar25 + dVar24 * -dVar27;
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 10;
    } while (lVar18 != 9);
    pdVar17 = local_590;
    local_2c0 = (dVar25 * dVar28 - dVar23) - dVar27 * dVar26;
    lVar18 = -9;
    do {
      *(double *)(local_2b8 + lVar18 * 8 + -8) = *(double *)(local_2b8 + lVar18 * 8 + -8) * 1e-06;
      *pdVar17 = *pdVar17 * 1000000.0;
      pdVar17 = pdVar17 + 10;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
    SUNDlsMat_denseScale(0.0,*(realtype ***)*puVar3,10,10);
    lVar18 = *(long *)*puVar3;
    lVar19 = 0;
    pdVar17 = local_5d8;
    do {
      dVar26 = local_168[lVar19];
      lVar20 = 0;
      pdVar16 = pdVar17;
      do {
        *(double *)(*(long *)(lVar18 + lVar20 * 8) + lVar19 * 8) =
             (*pdVar16 * dVar26) / local_168[lVar20];
        lVar20 = lVar20 + 1;
        pdVar16 = pdVar16 + 10;
      } while (lVar20 != 9);
      *(double *)(*(long *)(lVar18 + lVar19 * 8) + 0x48) =
           local_5d8[lVar19 * 10 + 9] / local_168[lVar19];
      lVar19 = lVar19 + 1;
      pdVar17 = pdVar17 + 1;
    } while (lVar19 != 9);
    lVar18 = *(long *)(*(long *)*puVar3 + 0x48);
    lVar19 = 0;
    do {
      *(double *)(lVar18 + lVar19 * 8) = *(double *)(local_308 + lVar19 * 8) * local_168[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 9);
    a = *(realtype ***)*puVar3;
    a[9][9] = local_2c0;
    SUNDlsMat_denseCopy(a,*(realtype ***)*puVar2,10,10);
    *jcurPtr = 1;
  }
  else {
    SUNDlsMat_denseCopy(*(realtype ***)*puVar3,*(realtype ***)*puVar2,10,10);
    *jcurPtr = 0;
  }
  SUNDlsMat_denseScale(-local_178._0_8_,*(realtype ***)*puVar2,10,10);
  SUNDlsMat_denseAddIdentity(*(realtype ***)*puVar2,10);
  sVar14 = SUNDlsMat_denseGETRF(*(realtype ***)*puVar2,10,10,*(sunindextype **)*puVar4);
  return (int)(sVar14 != 0);
}

Assistant:

int
Precond(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto reactor_type = udata->reactor_type;
  auto* P = udata->P;
  auto* Jbd = udata->Jbd;
  auto* pivot = udata->pivot;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    *jcurPtr = SUNFALSE;
  } else {
    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + u_d[i];
    }
    // Yks
    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    amrex::Real rhoinv = 1.0 / rho;
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = u_d[i] * rhoinv;
    }
    amrex::Real temp = u_d[NUM_SPECIES];
    // Activities
    amrex::Real activity[NUM_SPECIES] = {0.0};
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2C(rho, temp, massfrac, activity);
    int consP = static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    amrex::Real Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    DWDOT_SIMPLIFIED(Jmat, activity, &temp, &consP);

    // Scale Jacobian.  Load into P.
    SUNDlsMat_denseScale(0.0, Jbd[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    for (int i = 0; i < NUM_SPECIES; i++) {
      for (int k = 0; k < NUM_SPECIES; k++) {
        (Jbd[0][0])[k][i] = Jmat[k * (NUM_SPECIES + 1) + i] * mw[i] / mw[k];
      }
      (Jbd[0][0])[i][NUM_SPECIES] =
        Jmat[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    for (int i = 0; i < NUM_SPECIES; i++) {
      (Jbd[0][0])[NUM_SPECIES][i] =
        Jmat[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    (Jbd[0][0])[NUM_SPECIES][NUM_SPECIES] =
      Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1) - 1];

    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

    *jcurPtr = SUNTRUE;
  }

  // Scale by -gamma
  SUNDlsMat_denseScale(-gamma, P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

  // Add identity matrix and do LU decompositions on blocks in place.
  SUNDlsMat_denseAddIdentity(P[0][0], NUM_SPECIES + 1);
  sunindextype ierr = SUNDlsMat_denseGETRF(
    P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1, pivot[0][0]);
  if (ierr != 0) {
    return (1);
  }

  return (0);
}